

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlExpression.h
# Opt level: O2

void __thiscall GdlNumericExpression::GdlNumericExpression(GdlNumericExpression *this,int nValue)

{
  GdlSimpleExpression::GdlSimpleExpression((GdlSimpleExpression *)this);
  *(undefined ***)this = &PTR_Clone_00212000;
  this->m_nValue = nValue;
  this->m_munits = -1;
  this->m_fBoolean = false;
  GdlExpression::SetType((GdlExpression *)this,kexptNumber);
  return;
}

Assistant:

GdlNumericExpression(int nValue)
		:	GdlSimpleExpression(),
			m_nValue(nValue),
			m_munits(kmunitNone),
			m_fBoolean(false)
	{
		SetType(kexptNumber);
	}